

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createInternalLoad
          (LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNode *pPVar1;
  User *in_RDI;
  PSNode *node;
  PSNode *op1;
  Value *op;
  uint in_stack_ffffffffffffffcc;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffd8;
  
  llvm::User::getOperand(in_RDI,in_stack_ffffffffffffffcc);
  pPVar1 = getOperand(in_stack_ffffffffffffffd8,(Value *)in_RDI);
  pPVar1 = PointerGraph::create<(dg::pta::PSNodeType)2,dg::pta::PSNode*&>
                     ((PointerGraph *)pPVar1,(PSNode **)in_stack_ffffffffffffffd8);
  return pPVar1;
}

Assistant:

PSNode *
LLVMPointerGraphBuilder::createInternalLoad(const llvm::Instruction *Inst) {
    const llvm::Value *op = Inst->getOperand(0);

    PSNode *op1 = getOperand(op);
    PSNode *node = PS.create<PSNodeType::LOAD>(op1);
    assert(node);

    return node;
}